

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O0

void __thiscall
gimage::RAWImageIO::loadHeader(RAWImageIO *this,char *name,long *width,long *height,int *depth)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  undefined4 *in_R8;
  bool msbfirst;
  int type;
  long *in_stack_00000238;
  long *in_stack_00000240;
  bool *in_stack_00000248;
  int *in_stack_00000250;
  char *in_stack_00000258;
  string local_c8 [32];
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff5c;
  IOException *in_stack_ffffffffffffff60;
  allocator local_91;
  string local_90 [104];
  undefined4 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  uVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,1);
  if ((uVar1 & 1) == 0) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff58);
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,(char *)local_10,&local_91);
    std::operator+((char *)local_10,__rhs);
    std::operator+(local_10,(char *)__rhs);
    gutil::IOException::IOException
              (in_stack_ffffffffffffff60,(string *)CONCAT44(in_stack_ffffffffffffff5c,uVar2));
    __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            (in_stack_00000258,in_stack_00000250,in_stack_00000248,in_stack_00000240,
             in_stack_00000238);
  std::__cxx11::string::~string(local_c8);
  *local_28 = 1;
  return;
}

Assistant:

void RAWImageIO::loadHeader(const char *name, long &width, long &height,
                            int &depth) const
{
  int  type;
  bool msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  readRAWHeader(name, type, msbfirst, width, height);
  depth=1;
}